

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# I2sAnalyzer.cpp
# Opt level: O0

void __thiscall I2sAnalyzer::SetupForGettingFirstFrame(I2sAnalyzer *this)

{
  element_type *peVar1;
  I2sAnalyzer *this_local;
  
  GetNextBit(this,&this->mLastData,&this->mLastFrame,&this->mLastSample);
  while( true ) {
    GetNextBit(this,&this->mCurrentData,&this->mCurrentFrame,&this->mCurrentSample);
    if ((this->mCurrentFrame == BIT_HIGH) && (this->mLastFrame == BIT_LOW)) break;
    this->mLastFrame = this->mCurrentFrame;
    this->mLastData = this->mCurrentData;
    this->mLastSample = this->mCurrentSample;
  }
  peVar1 = std::auto_ptr<I2sAnalyzerSettings>::operator->(&this->mSettings);
  if (peVar1->mBitAlignment == BITS_SHIFTED_RIGHT_1) {
    this->mLastFrame = this->mCurrentFrame;
    this->mLastData = this->mCurrentData;
    this->mLastSample = this->mCurrentSample;
    GetNextBit(this,&this->mCurrentData,&this->mCurrentFrame,&this->mCurrentSample);
  }
  return;
}

Assistant:

void I2sAnalyzer::SetupForGettingFirstFrame()
{
    GetNextBit( mLastData, mLastFrame, mLastSample ); // we have to throw away one bit to get enough history on the FRAME line.

    for( ;; )
    {
        GetNextBit( mCurrentData, mCurrentFrame, mCurrentSample );

        if( mCurrentFrame == BIT_HIGH && mLastFrame == BIT_LOW )
        {
            if( mSettings->mBitAlignment == BITS_SHIFTED_RIGHT_1 )
            {
                // we need to advance to the next bit past the frame.
                mLastFrame = mCurrentFrame;
                mLastData = mCurrentData;
                mLastSample = mCurrentSample;

                GetNextBit( mCurrentData, mCurrentFrame, mCurrentSample );
            }
            return;
        }

        mLastFrame = mCurrentFrame;
        mLastData = mCurrentData;
        mLastSample = mCurrentSample;
    }
}